

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* lest::split_arguments
            (pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *__return_storage_ptr__,texts *args)

{
  pointer pcVar1;
  undefined1 uVar2;
  int iVar3;
  undefined8 uVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  runtime_error *this;
  long *plVar6;
  size_type *psVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  pointer pbVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  _Alloc_hider _Var14;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined1 uVar18;
  undefined1 uVar19;
  undefined1 uVar20;
  seed_t sVar21;
  bool bVar22;
  text val;
  text opt;
  text arg;
  texts in;
  text local_228;
  int local_204;
  undefined1 *local_200;
  long local_1f8;
  undefined1 local_1f0;
  undefined7 uStack_1ef;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  undefined8 local_1c0;
  undefined8 local_1b8;
  ulong local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 local_180;
  undefined8 local_178;
  undefined8 local_170;
  seed_t local_168;
  undefined8 local_160;
  value_type local_158;
  text local_138;
  text local_118;
  text local_f8;
  text local_d8;
  undefined1 local_b8 [32];
  _Alloc_hider local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbVar10 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (pbVar10 ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    iVar3 = 1;
    uVar15 = false;
    uVar2 = false;
    uVar16 = false;
    uVar13 = false;
    uVar12 = false;
    uVar17 = false;
    uVar8 = false;
    sVar21 = 0;
    uVar18 = false;
    uVar9 = false;
    uVar19 = false;
    uVar20 = false;
    uVar11 = false;
  }
  else {
    local_204 = 1;
    bVar22 = true;
    local_180 = 0;
    local_188 = 0;
    local_190 = 0;
    local_1a0 = 0;
    local_198 = 0;
    local_168 = 0;
    local_160 = 0;
    local_1c0 = 0;
    local_178 = 0;
    local_170 = 0;
    local_1b8 = 0;
    local_1b0 = 0;
    local_1a8 = 0;
    local_58 = __return_storage_ptr__;
    do {
      local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
      local_1e0._M_string_length = 0;
      local_1e0.field_2._M_local_buf[0] = '\0';
      local_200 = &local_1f0;
      local_1f8 = 0;
      local_1f0 = 0;
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      pcVar1 = (pbVar10->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_158,pcVar1,pcVar1 + pbVar10->_M_string_length);
      local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_228,local_158._M_dataplus._M_p,
                 local_158._M_dataplus._M_p + local_158._M_string_length);
      split_option((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_b8,&local_228);
      std::__cxx11::string::operator=((string *)&local_1e0,(string *)local_b8);
      std::__cxx11::string::operator=((string *)&local_200,(string *)&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_p != &local_88) {
        operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
        operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      if (bVar22) {
        if (*local_1e0._M_dataplus._M_p != '-') {
          bVar22 = false;
          goto LAB_001092ef;
        }
        iVar3 = std::__cxx11::string::compare((char *)&local_1e0);
        if (iVar3 == 0) {
          bVar22 = false;
        }
        else {
          uVar4 = std::__cxx11::string::compare((char *)&local_1e0);
          if (((int)uVar4 == 0) ||
             (uVar4 = std::__cxx11::string::compare((char *)&local_1e0), (int)uVar4 == 0)) {
            local_180 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
          }
          else {
            uVar4 = std::__cxx11::string::compare((char *)&local_1e0);
            if (((int)uVar4 == 0) ||
               (uVar4 = std::__cxx11::string::compare((char *)&local_1e0), (int)uVar4 == 0)) {
              local_188 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
            }
            else {
              uVar4 = std::__cxx11::string::compare((char *)&local_1e0);
              if (((int)uVar4 == 0) ||
                 (uVar4 = std::__cxx11::string::compare((char *)&local_1e0), (int)uVar4 == 0)) {
                local_190 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
              }
              else {
                uVar4 = std::__cxx11::string::compare((char *)&local_1e0);
                if (((int)uVar4 == 0) ||
                   (uVar4 = std::__cxx11::string::compare((char *)&local_1e0), (int)uVar4 == 0)) {
                  local_198 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
                }
                else {
                  uVar4 = std::__cxx11::string::compare((char *)&local_1e0);
                  if (((int)uVar4 == 0) ||
                     (uVar4 = std::__cxx11::string::compare((char *)&local_1e0), (int)uVar4 == 0)) {
                    local_1a0 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
                  }
                  else {
                    uVar4 = std::__cxx11::string::compare((char *)&local_1e0);
                    if (((int)uVar4 == 0) ||
                       (uVar4 = std::__cxx11::string::compare((char *)&local_1e0), (int)uVar4 == 0))
                    {
                      local_1a8 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
                    }
                    else {
                      uVar4 = std::__cxx11::string::compare((char *)&local_1e0);
                      if (((int)uVar4 == 0) ||
                         (uVar4 = std::__cxx11::string::compare((char *)&local_1e0), (int)uVar4 == 0
                         )) {
                        local_1b0 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
                      }
                      else {
                        uVar4 = std::__cxx11::string::compare((char *)&local_1e0);
                        if (((int)uVar4 == 0) ||
                           (uVar4 = std::__cxx11::string::compare((char *)&local_1e0),
                           (int)uVar4 == 0)) {
                          local_1b8 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
                        }
                        else {
                          uVar4 = std::__cxx11::string::compare((char *)&local_1e0);
                          if (((int)uVar4 == 0) ||
                             (uVar4 = std::__cxx11::string::compare((char *)&local_1e0),
                             (int)uVar4 == 0)) {
                            local_1c0 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
                          }
                          else {
                            uVar4 = std::__cxx11::string::compare((char *)&local_1e0);
                            if ((int)uVar4 == 0) {
                              local_160 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
                            }
                            else {
                              iVar3 = std::__cxx11::string::compare((char *)&local_1e0);
                              if ((iVar3 != 0) ||
                                 (iVar3 = std::__cxx11::string::compare((char *)&local_200),
                                 iVar3 != 0)) {
                                iVar3 = std::__cxx11::string::compare((char *)&local_1e0);
                                if ((iVar3 == 0) &&
                                   (uVar4 = std::__cxx11::string::compare((char *)&local_200),
                                   (int)uVar4 == 0)) {
                                  local_170 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
                                }
                                else {
                                  iVar3 = std::__cxx11::string::compare((char *)&local_1e0);
                                  if ((iVar3 == 0) &&
                                     (uVar4 = std::__cxx11::string::compare((char *)&local_200),
                                     (int)uVar4 == 0)) {
                                    local_178 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
                                  }
                                  else {
                                    iVar3 = std::__cxx11::string::compare((char *)&local_1e0);
                                    if (iVar3 == 0) {
                                      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
                                      std::__cxx11::string::_M_construct<char_const*>
                                                ((string *)&local_d8,"--random-seed","");
                                      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
                                      std::__cxx11::string::_M_construct<char*>
                                                ((string *)&local_f8,local_200,local_200 + local_1f8
                                                );
                                      local_168 = seed(&local_d8,&local_f8);
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                                        operator_delete(local_f8._M_dataplus._M_p,
                                                        local_f8.field_2._M_allocated_capacity + 1);
                                      }
                                      paVar5 = &local_d8.field_2;
                                      _Var14._M_p = local_d8._M_dataplus._M_p;
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_d8._M_dataplus._M_p != paVar5) goto LAB_0010949f;
                                    }
                                    else {
                                      iVar3 = std::__cxx11::string::compare((char *)&local_1e0);
                                      if (iVar3 != 0) {
                                        this = (runtime_error *)__cxa_allocate_exception(0x10);
                                        std::operator+(&local_50,"unrecognised option \'",&local_1e0
                                                      );
                                        plVar6 = (long *)std::__cxx11::string::append
                                                                   ((char *)&local_50);
                                        local_b8._0_8_ = *plVar6;
                                        psVar7 = (size_type *)(plVar6 + 2);
                                        if ((size_type *)local_b8._0_8_ == psVar7) {
                                          local_b8._16_8_ = *psVar7;
                                          local_b8._24_8_ = plVar6[3];
                                          local_b8._0_8_ = local_b8 + 0x10;
                                        }
                                        else {
                                          local_b8._16_8_ = *psVar7;
                                        }
                                        local_b8._8_8_ = plVar6[1];
                                        *plVar6 = (long)psVar7;
                                        plVar6[1] = 0;
                                        *(undefined1 *)(plVar6 + 2) = 0;
                                        std::runtime_error::runtime_error(this,(string *)local_b8);
                                        __cxa_throw(this,&std::runtime_error::typeinfo,
                                                    std::runtime_error::~runtime_error);
                                      }
                                      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
                                      std::__cxx11::string::_M_construct<char_const*>
                                                ((string *)&local_118,"--repeat","");
                                      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
                                      std::__cxx11::string::_M_construct<char*>
                                                ((string *)&local_138,local_200,
                                                 local_200 + local_1f8);
                                      local_204 = repeat(&local_118,&local_138);
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_138._M_dataplus._M_p != &local_138.field_2) {
                                        operator_delete(local_138._M_dataplus._M_p,
                                                        local_138.field_2._M_allocated_capacity + 1)
                                        ;
                                      }
                                      paVar5 = &local_118.field_2;
                                      _Var14._M_p = local_118._M_dataplus._M_p;
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_118._M_dataplus._M_p != paVar5) {
LAB_0010949f:
                                        operator_delete(_Var14._M_p,
                                                        paVar5->_M_allocated_capacity + 1);
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      else {
LAB_001092ef:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_78,&local_158);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      if (local_200 != &local_1f0) {
        operator_delete(local_200,CONCAT71(uStack_1ef,local_1f0) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,
                        CONCAT71(local_1e0.field_2._M_allocated_capacity._1_7_,
                                 local_1e0.field_2._M_local_buf[0]) + 1);
      }
      pbVar10 = pbVar10 + 1;
    } while (pbVar10 !=
             (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
    uVar16 = (undefined1)local_1b8;
    uVar2 = 1;
    if ((local_1b0 & 1) == 0) {
      uVar2 = uVar16;
    }
    uVar8 = (undefined1)local_160;
    uVar12 = (undefined1)local_178;
    uVar13 = (undefined1)local_170;
    uVar15 = (undefined1)local_1a8;
    uVar17 = (undefined1)local_1c0;
    uVar18 = (undefined1)local_198;
    uVar9 = (undefined1)local_1a0;
    uVar19 = (undefined1)local_190;
    uVar20 = (undefined1)local_188;
    uVar11 = (undefined1)local_180;
    sVar21 = local_168;
    __return_storage_ptr__ = local_58;
    iVar3 = local_204;
  }
  (__return_storage_ptr__->first).help = (bool)uVar11;
  (__return_storage_ptr__->first).abort = (bool)uVar20;
  (__return_storage_ptr__->first).count = (bool)uVar19;
  (__return_storage_ptr__->first).list = (bool)uVar9;
  (__return_storage_ptr__->first).tags = (bool)uVar18;
  (__return_storage_ptr__->first).time = (bool)uVar15;
  (__return_storage_ptr__->first).pass = (bool)uVar2;
  (__return_storage_ptr__->first).zen = (bool)uVar16;
  (__return_storage_ptr__->first).lexical = (bool)uVar13;
  (__return_storage_ptr__->first).random = (bool)uVar12;
  (__return_storage_ptr__->first).verbose = (bool)uVar17;
  (__return_storage_ptr__->first).version = (bool)uVar8;
  (__return_storage_ptr__->first).repeat = iVar3;
  (__return_storage_ptr__->first).seed = sVar21;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&__return_storage_ptr__->second,&local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<options, texts>
split_arguments( texts args )
{
    options option; texts in;

    bool in_options = true;

    for ( texts::iterator pos = args.begin(); pos != args.end() ; ++pos )
    {
        text opt, val, arg = *pos;
        tie( opt, val ) = split_option( arg );

        if ( in_options )
        {
            if      ( opt[0] != '-'                             ) { in_options     = false;           }
            else if ( opt == "--"                               ) { in_options     = false; continue; }
            else if ( opt == "-h"      || "--help"       == opt ) { option.help    =  true; continue; }
            else if ( opt == "-a"      || "--abort"      == opt ) { option.abort   =  true; continue; }
            else if ( opt == "-c"      || "--count"      == opt ) { option.count   =  true; continue; }
            else if ( opt == "-g"      || "--list-tags"  == opt ) { option.tags    =  true; continue; }
            else if ( opt == "-l"      || "--list-tests" == opt ) { option.list    =  true; continue; }
            else if ( opt == "-t"      || "--time"       == opt ) { option.time    =  true; continue; }
            else if ( opt == "-p"      || "--pass"       == opt ) { option.pass    =  true; continue; }
            else if ( opt == "-z"      || "--pass-zen"   == opt ) { option.zen     =  true; continue; }
            else if ( opt == "-v"      || "--verbose"    == opt ) { option.verbose =  true; continue; }
            else if (                     "--version"    == opt ) { option.version =  true; continue; }
            else if ( opt == "--order" && "declared"     == val ) { /* by definition */   ; continue; }
            else if ( opt == "--order" && "lexical"      == val ) { option.lexical =  true; continue; }
            else if ( opt == "--order" && "random"       == val ) { option.random  =  true; continue; }
            else if ( opt == "--random-seed" ) { option.seed   = seed  ( "--random-seed", val ); continue; }
            else if ( opt == "--repeat"      ) { option.repeat = repeat( "--repeat"     , val ); continue; }
            else throw std::runtime_error( "unrecognised option '" + opt + "' (try option --help)" );
        }
        in.push_back( arg );
    }
    option.pass = option.pass || option.zen;

    return std::make_pair( option, in );
}